

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall Parser::ExpectToken(Parser *this,Token expected,string *err)

{
  bool bVar1;
  Token t;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  string message;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  t = Lexer::ReadToken(&this->lexer_);
  bVar1 = true;
  if (t != expected) {
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"expected ","");
    Lexer::TokenName(expected);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar2[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,", got ","");
    Lexer::TokenName(t);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Lexer::TokenErrorHint(expected);
    std::__cxx11::string::append((char *)&local_70);
    bVar1 = Lexer::Error(&this->lexer_,&local_70,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool Parser::ExpectToken(Lexer::Token expected, string* err) {
  Lexer::Token token = lexer_.ReadToken();
  if (token != expected) {
    string message = string("expected ") + Lexer::TokenName(expected);
    message += string(", got ") + Lexer::TokenName(token);
    message += Lexer::TokenErrorHint(expected);
    return lexer_.Error(message, err);
  }
  return true;
}